

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O0

void PackedArray_set(PackedArray *a,uint32_t offset,uint32_t in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  sbyte sVar6;
  uint32_t high;
  uint32_t low;
  uint32_t mask;
  uint32_t bitsAvailable;
  uint32_t startBit;
  uint32_t bitsPerItem;
  uint32_t *out;
  uint32_t in_local;
  uint32_t offset_local;
  PackedArray *a_local;
  
  if (a == (PackedArray *)0x0) {
    __assert_fail("a != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x1fc,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
  }
  uVar1 = a->bitsPerItem;
  puVar5 = a[1].padding + (((ulong)offset * (ulong)uVar1 >> 5) - 2);
  uVar2 = offset * uVar1 & 0x1f;
  uVar3 = 0x20 - uVar2;
  uVar4 = (int)(1L << ((byte)uVar1 & 0x3f)) - 1;
  if (((uVar4 ^ 0xffffffff) & in) == 0) {
    sVar6 = (sbyte)uVar2;
    if (uVar3 < uVar1) {
      *puVar5 = *puVar5 & (uVar4 << sVar6 ^ 0xffffffff) | in << sVar6;
      puVar5[1] = puVar5[1] & (uVar4 >> (0x20U - sVar6 & 0x1f) ^ 0xffffffff) |
                  in >> ((byte)uVar3 & 0x1f);
    }
    else {
      *puVar5 = *puVar5 & (uVar4 << sVar6 ^ 0xffffffff) | in << sVar6;
    }
    return;
  }
  __assert_fail("0 == (~mask & in)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                ,0x206,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
}

Assistant:

void PackedArray_set(PackedArray* a, const uint32_t offset, const uint32_t in)
{
  uint32_t* __restrict out;
  uint32_t bitsPerItem;
  uint32_t startBit;
  uint32_t bitsAvailable;
  uint32_t mask;

  PACKEDARRAY_ASSERT(a != NULL);

  bitsPerItem = a->bitsPerItem;

  out = &a->buffer[((uint64_t)offset * (uint64_t)bitsPerItem) / 32];
  startBit = ((uint64_t)offset * (uint64_t)bitsPerItem) % 32;

  bitsAvailable = 32 - startBit;

  mask = (uint32_t)(1ULL << bitsPerItem) - 1;
  PACKEDARRAY_ASSERT(0 == (~mask & in));

  if (bitsPerItem <= bitsAvailable)
  {
    out[0] = (out[0] & ~(mask << startBit)) | (in << startBit);
  }
  else
  {
    // value spans 2 buffer cells
    uint32_t low, high;

    low = in << startBit;
    high = in >> bitsAvailable;

    out[0] = (out[0] & ~(mask << startBit)) | low;

    out[1] = (out[1] & ~(mask >> (32 - startBit))) | high;
  }
}